

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_> *
AllBlockFilterTypes(void)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 *in_stack_00000010;
  once_flag *in_stack_00000018;
  set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
  *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (AllBlockFilterTypes()::types == '\0') {
    iVar2 = __cxa_guard_acquire(&AllBlockFilterTypes()::types);
    if (iVar2 != 0) {
      std::set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>::set
                (in_stack_ffffffffffffffe8);
      __cxa_atexit(std::
                   set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                   ::~set,&AllBlockFilterTypes::types,&__dso_handle);
      __cxa_guard_release(&AllBlockFilterTypes()::types);
    }
  }
  std::call_once<AllBlockFilterTypes()::__0>(in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &AllBlockFilterTypes::types;
  }
  __stack_chk_fail();
}

Assistant:

const std::set<BlockFilterType>& AllBlockFilterTypes()
{
    static std::set<BlockFilterType> types;

    static std::once_flag flag;
    std::call_once(flag, []() {
            for (const auto& entry : g_filter_types) {
                types.insert(entry.first);
            }
        });

    return types;
}